

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::~FileDescriptorProto(FileDescriptorProto *this)

{
  FileDescriptorProto *this_local;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_00d601a0;
  SharedDtor(this);
  RepeatedField<int>::~RepeatedField(&this->weak_dependency_);
  RepeatedField<int>::~RepeatedField(&this->public_dependency_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField(&this->extension_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::~RepeatedPtrField(&this->service_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::~RepeatedPtrField(&this->enum_type_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::~RepeatedPtrField(&this->message_type_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField(&this->dependency_);
  internal::InternalMetadataWithArena::~InternalMetadataWithArena(&this->_internal_metadata_);
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

FileDescriptorProto::~FileDescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.FileDescriptorProto)
  SharedDtor();
}